

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiSolvers.cc
# Opt level: O1

void __thiscall Glucose::MultiSolvers::generateAllSolvers(MultiSolvers *this)

{
  SharedCompanion *this_00;
  int iVar1;
  ParallelSolver *in_RAX;
  undefined4 extraout_var;
  int iVar2;
  ParallelSolver *s;
  ParallelSolver *local_28;
  
  iVar1 = this->nbsolvers;
  local_28 = in_RAX;
  if (1 < iVar1) {
    iVar2 = 1;
    do {
      iVar1 = (**((*(this->solvers).data)->super_SimpSolver).super_Solver.super_Clone._vptr_Clone)()
      ;
      local_28 = (ParallelSolver *)CONCAT44(extraout_var,iVar1);
      vec<Glucose::ParallelSolver_*>::push(&this->solvers,&local_28);
      (local_28->super_SimpSolver).super_Solver.verbosity = 0;
      *(int *)&(local_28->super_SimpSolver).field_0x5ac = iVar2;
      this_00 = this->sharedcomp;
      local_28->sharedcomp = this_00;
      SharedCompanion::addSolver(this_00,local_28);
      iVar2 = iVar2 + 1;
      iVar1 = this->nbsolvers;
    } while (iVar2 < iVar1);
  }
  SolverConfiguration::configure(this,iVar1);
  this->allClonesAreBuilt = 1;
  return;
}

Assistant:

void MultiSolvers::generateAllSolvers() {
    assert(solvers[0] != NULL);
    assert(allClonesAreBuilt == 0);

    for(int i = 1; i < nbsolvers; i++) {
        ParallelSolver *s = (ParallelSolver *) solvers[0]->clone();
        solvers.push(s);
        s->verbosity = 0; // No reportf in solvers... All is done in MultiSolver
        s->setThreadNumber(i);
        s->sharedcomp = this->sharedcomp;
        this->sharedcomp->addSolver(s);
        assert(solvers[i]->threadNumber() == i);
    }

    adjustParameters();

    allClonesAreBuilt = 1;
}